

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_0::hufBuildDecTable(Int64 *hcode,int im,int iM,HufDec *hdecod)

{
  undefined1 auVar1 [16];
  uint uVar2;
  Int64 IVar3;
  Int64 IVar4;
  uint *puVar5;
  ulong uVar6;
  void *pvVar7;
  void *pvVar8;
  byte bVar9;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  Int64 i_1;
  HufDec *pl_1;
  int i;
  int *p;
  HufDec *pl;
  int l;
  Int64 c;
  long local_50;
  uint *local_48;
  int local_3c;
  int local_c;
  
  for (local_c = in_ESI; local_c <= in_EDX; local_c = local_c + 1) {
    IVar3 = hufCode(*(Int64 *)(in_RDI + (long)local_c * 8));
    IVar4 = hufLength(*(Int64 *)(in_RDI + (long)local_c * 8));
    uVar2 = (uint)IVar4;
    bVar9 = (byte)IVar4;
    if (IVar3 >> (bVar9 & 0x3f) != 0) {
      invalidTableEntry();
    }
    if ((int)uVar2 < 0xf) {
      if (uVar2 != 0) {
        local_48 = (uint *)(in_RCX + (IVar3 << (0xe - bVar9 & 0x3f)) * 0x10);
        for (local_50 = (long)(1 << (0xe - bVar9 & 0x1f)); local_50 != 0; local_50 = local_50 + -1)
        {
          if (((char)*local_48 != '\0') || (*(long *)(local_48 + 2) != 0)) {
            invalidTableEntry();
          }
          *local_48 = *local_48 & 0xffffff00 | uVar2 & 0xff;
          *local_48 = *local_48 & 0xff | local_c << 8;
          local_48 = local_48 + 4;
        }
      }
    }
    else {
      puVar5 = (uint *)(in_RCX + (IVar3 >> (bVar9 - 0xe & 0x3f)) * 0x10);
      if ((char)*puVar5 != '\0') {
        invalidTableEntry();
      }
      *puVar5 = *puVar5 & 0xff | (((int)*puVar5 >> 8) + 1) * 0x100;
      if (*(long *)(puVar5 + 2) == 0) {
        pvVar8 = operator_new__(4);
        *(void **)(puVar5 + 2) = pvVar8;
      }
      else {
        pvVar8 = *(void **)(puVar5 + 2);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)((int)*puVar5 >> 8);
        uVar6 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        pvVar7 = operator_new__(uVar6);
        *(void **)(puVar5 + 2) = pvVar7;
        for (local_3c = 0; local_3c < ((int)*puVar5 >> 8) + -1; local_3c = local_3c + 1) {
          *(undefined4 *)(*(long *)(puVar5 + 2) + (long)local_3c * 4) =
               *(undefined4 *)((long)pvVar8 + (long)local_3c * 4);
        }
        if (pvVar8 != (void *)0x0) {
          operator_delete__(pvVar8);
        }
      }
      *(int *)(*(long *)(puVar5 + 2) + (long)(((int)*puVar5 >> 8) + -1) * 4) = local_c;
    }
  }
  return;
}

Assistant:

void
hufBuildDecTable
    (const Int64*	hcode,		// i : encoding table
     int		im,		// i : min index in hcode
     int		iM,		// i : max index in hcode
     HufDec *		hdecod)		//  o: (allocated by caller)
     					//     decoding table [HUF_DECSIZE]
{
    //
    // Init hashtable & loop on all codes.
    // Assumes that hufClearDecTable(hdecod) has already been called.
    //

    for (; im <= iM; im++)
    {
	Int64 c = hufCode (hcode[im]);
	int l = hufLength (hcode[im]);

	if (c >> l)
	{
	    //
	    // Error: c is supposed to be an l-bit code,
	    // but c contains a value that is greater
	    // than the largest l-bit number.
	    //

	    invalidTableEntry();
	}

	if (l > HUF_DECBITS)
	{
	    //
	    // Long code: add a secondary entry
	    //

	    HufDec *pl = hdecod + (c >> (l - HUF_DECBITS));

	    if (pl->len)
	    {
		//
		// Error: a short code has already
		// been stored in table entry *pl.
		//

		invalidTableEntry();
	    }

	    pl->lit++;

	    if (pl->p)
	    {
		int *p = pl->p;
		pl->p = new int [pl->lit];

		for (int i = 0; i < pl->lit - 1; ++i)
		    pl->p[i] = p[i];

		delete [] p;
	    }
	    else
	    {
		pl->p = new int [1];
	    }

	    pl->p[pl->lit - 1]= im;
	}
	else if (l)
	{
	    //
	    // Short code: init all primary entries
	    //

	    HufDec *pl = hdecod + (c << (HUF_DECBITS - l));

	    for (Int64 i = 1 << (HUF_DECBITS - l); i > 0; i--, pl++)
	    {
		if (pl->len || pl->p)
		{
		    //
		    // Error: a short code or a long code has
		    // already been stored in table entry *pl.
		    //

		    invalidTableEntry();
		}

		pl->len = l;
		pl->lit = im;
	    }
	}
    }
}